

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O1

void __thiscall foxxll::ufs_file_base::lock(ufs_file_base *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  unique_lock<std::mutex> fd_lock;
  ostringstream msg;
  unique_lock<std::mutex> local_1d8;
  string local_1c8;
  ushort local_1a8;
  undefined2 local_1a6;
  undefined8 local_1a0;
  undefined8 uStack_198;
  ostringstream local_188 [376];
  
  local_1d8._M_device = &this->fd_mutex_;
  local_1d8._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_1d8);
  local_1d8._M_owns = true;
  local_1a8 = ~(ushort)this->mode_ & 1;
  local_1a6 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  iVar1 = fcntl64(this->file_des_,6);
  if (-1 < iVar1) {
    std::unique_lock<std::mutex>::~unique_lock(&local_1d8);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"Error in ",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"virtual void foxxll::ufs_file_base::lock()",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188," : ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"fcntl(,F_SETLK,) path=",0x16);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_188,(this->filename_)._M_dataplus._M_p,
                      (this->filename_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," fd=",4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->file_des_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : ",3);
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  this_00 = (io_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  io_error::io_error(this_00,&local_1c8);
  __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void ufs_file_base::lock()
{
#if FOXXLL_WINDOWS || defined(__MINGW32__)
    // not yet implemented
#else
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);
    struct flock lock_struct;
    lock_struct.l_type = static_cast<short>(mode_ & RDONLY ? F_RDLCK : F_RDLCK | F_WRLCK);
    lock_struct.l_whence = SEEK_SET;
    lock_struct.l_start = 0;
    lock_struct.l_len = 0; // lock all bytes
    if ((::fcntl(file_des_, F_SETLK, &lock_struct)) < 0)
        FOXXLL_THROW_ERRNO(io_error, "fcntl(,F_SETLK,) path=" << filename_ << " fd=" << file_des_);
#endif
}